

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O3

void setlogfile(char *fname)

{
  char *__filename;
  FILE *__stream;
  
  if (logfile != (FILE *)0x0) {
    fclose((FILE *)logfile);
    logfile = (FILE *)0x0;
  }
  if ((fname == (char *)0x0) || (*fname == '\0')) {
    __stream = (FILE *)0x0;
  }
  else {
    __filename = findfile(fname,"w");
    __stream = (FILE *)logfile;
    if (__filename != (char *)0x0) {
      logfile = (FILE *)fopen64(__filename,"w");
      __stream = (FILE *)logfile;
    }
  }
  if (__stream == (FILE *)0x0) {
    __stream = _stdout;
  }
  if (__stream == (FILE *)0x0) {
    return;
  }
  setvbuf(__stream,(char *)0x0,1,0x2000);
  return;
}

Assistant:

void setlogfile(const char *fname)
{
    closelogfile();
    if(fname && fname[0])
    {
        fname = findfile(fname, "w");
        if(fname) logfile = fopen(fname, "w");
    }
    FILE *f = getlogfile();
    if(f) setvbuf(f, NULL, _IOLBF, BUFSIZ);
}